

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
pstore::dump::string::write_unquoted<std::ostream>
          (basic_ostream<char,_std::char_traits<char>_> *os,string *v)

{
  char cVar1;
  undefined8 in_RAX;
  char *pcVar2;
  char *pcVar4;
  undefined8 uStack_38;
  size_type sVar3;
  
  sVar3 = v->_M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (v->_M_dataplus)._M_p;
    uStack_38 = in_RAX;
    if ((byte)(*pcVar4 - 0x21U) < 2) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"\\",1);
      sVar3 = v->_M_string_length;
      if (sVar3 == 0) {
        return os;
      }
      pcVar4 = (v->_M_dataplus)._M_p;
    }
    pcVar2 = pcVar4 + sVar3;
    do {
      cVar1 = *pcVar4;
      if (cVar1 == '\\') {
        uStack_38._0_7_ = CONCAT16(0x5c,(undefined6)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 6),1);
      }
      uStack_38 = CONCAT17(cVar1,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != pcVar2);
  }
  return os;
}

Assistant:

OStream & string::write_unquoted (OStream & os, std::string const & v) {
            // If the string starts with backslash or bang, prefix with a backslash
            if (v.length () > 0) {
                auto const front = v.front ();
                if (front == '\"' || front == '!') {
                    os << "\\";
                }
            }
            // Emit the characters; a backslash is escaped.
            for (char ch : v) {
                if (ch == '\\') {
                    os << '\\';
                }
                os << ch;
            }
            return os;
        }